

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O1

int virtual_print_insn(dill_stream c,void *info_ptr,void *i)

{
  byte bVar1;
  uint uVar2;
  private_ctx pdVar3;
  int iVar4;
  char *pcVar5;
  char **ppcVar6;
  long lVar7;
  virtual_insn *insn;
  ulong uVar8;
  undefined8 uVar9;
  uint uVar10;
  char *pcVar11;
  char *__format;
  char *pcVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  if (0x18 < *i) {
    return 0x28;
  }
  bVar1 = *(byte *)((long)i + 1);
  uVar10 = (uint)bVar1;
  switch(*i) {
  case 0:
    ppcVar6 = arith3_name;
    goto LAB_0010cbe3;
  case 1:
    pcVar11 = arith3_name[(char)bVar1];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar2 = *(uint *)((long)i + 0xc);
    pcVar12 = "%s%s%si %c%d, %c%d, %zu";
    uVar13 = *(ulong *)((long)i + 0x10);
    goto LAB_0010cc8e;
  case 2:
    pcVar11 = arith2_name[(char)bVar1];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar2 = *(uint *)((long)i + 0xc);
    pcVar12 = "%s %c%d, %c%d";
    goto LAB_0010c6d4;
  case 3:
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar13 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    uVar10 = *(uint *)((long)i + 8);
    pcVar12 = "ret%s %c%d";
    goto LAB_0010c887;
  case 4:
    pcVar11 = dill_type_names[bVar1 >> 4];
    pcVar12 = dill_type_names[uVar10 & 0xf];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    printf("cv%s2%s %c%d, %c%d",pcVar11,pcVar12,(ulong)uVar14,(ulong)uVar15,(ulong)uVar10,
           (ulong)*(uint *)((long)i + 0xc));
    break;
  case 5:
    pcVar11 = "bs";
    if ((bVar1 & 0x20) == 0) {
      pcVar11 = "";
    }
    pcVar12 = "st";
    if ((bVar1 & 0x10) == 0) {
      pcVar12 = "ld";
    }
    pcVar5 = dill_type_names[uVar10 & 0xf];
    uVar13 = 0x50;
    uVar10 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar14 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    uVar15 = *(uint *)((long)i + 0xc);
    uVar8 = 0x50;
    if (99 < *(int *)((long)i + 0x10)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0x10));
      uVar8 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    __format = "%s%s%s %c%d, %c%d, %c%d";
    goto LAB_0010cb23;
  case 6:
    pcVar11 = "bs";
    if ((bVar1 & 0x20) == 0) {
      pcVar11 = "";
    }
    pcVar12 = "st";
    if ((bVar1 & 0x10) == 0) {
      pcVar12 = "ld";
    }
    pcVar5 = dill_type_names[uVar10 & 0xf];
    uVar13 = 0x50;
    uVar10 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar14 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    uVar15 = *(uint *)((long)i + 0xc);
    __format = "%s%s%si %c%d, %c%d, %zu";
    uVar8 = *(ulong *)((long)i + 0x10);
LAB_0010cb23:
    printf(__format,pcVar11,pcVar12,pcVar5,(ulong)uVar10,(ulong)uVar14,uVar13,(ulong)uVar15,uVar8);
    break;
  case 7:
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar13 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    printf("set%s %c%d, %zx",pcVar11,uVar13,(ulong)*(uint *)((long)i + 8),
           *(undefined8 *)((long)i + 0x10));
    break;
  case 8:
    uVar13 = *(ulong *)((long)i + 0x10);
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar8 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar8 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    printf("set%s %c%d, %g 0x(%x)0x(%x)",*(undefined8 *)((long)i + 0x10),pcVar11,uVar8,
           (ulong)*(uint *)((long)i + 8),uVar13 & 0xffffffff,uVar13 >> 0x20);
    break;
  case 9:
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar2 = *(uint *)((long)i + 0xc);
    pcVar12 = "mov%s %c%d, %c%d";
LAB_0010c6d4:
    printf(pcVar12,pcVar11,(ulong)uVar14,(ulong)uVar15,(ulong)uVar10,(ulong)uVar2);
    break;
  case 10:
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar9 = *(undefined8 *)((long)i + 0x10);
    pcVar12 = "ret%si %zu";
    goto LAB_0010ce3f;
  case 0xb:
    pdVar3 = c->p;
    pcVar11 = branch_op_names[(char)bVar1];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    printf("b%s %c%d, %c%d, L%d",pcVar11,(ulong)uVar14,(ulong)uVar15,(ulong)uVar10,
           (ulong)*(uint *)((long)i + 0xc),(ulong)*(uint *)((long)i + 0x10));
    ppcVar6 = (pdVar3->branch_table).label_name;
    goto LAB_0010ca5d;
  case 0xc:
    pdVar3 = c->p;
    pcVar11 = branch_op_names[(char)bVar1];
    uVar13 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    printf("b%si %c%d, %p, L%d",pcVar11,uVar13,(ulong)*(uint *)((long)i + 8),
           *(undefined8 *)((long)i + 0x18),(ulong)*(uint *)((long)i + 0xc));
    ppcVar6 = (pdVar3->branch_table).label_name;
    lVar7 = (long)*(int *)((long)i + 0xc);
    goto LAB_0010cce0;
  case 0xd:
    pdVar3 = c->p;
    printf("br L%d",(ulong)*(uint *)((long)i + 0x10));
    ppcVar6 = (pdVar3->branch_table).label_name;
LAB_0010ca5d:
    lVar7 = (long)*(int *)((long)i + 0x10);
    goto LAB_0010cce0;
  case 0xe:
    if (*(int *)((long)i + 8) != 1) {
      if (*(int *)((long)i + 8) != 0) {
        return 0x28;
      }
      pcVar11 = "special NOP";
      goto LAB_0010c65e;
    }
    pcVar11 = prefix_names_rel + *(int *)(prefix_names_rel + *(long *)((long)i + 0x10) * 4);
    pcVar12 = "special SEGMENTED %s";
    goto LAB_0010ccf4;
  case 0xf:
    uVar13 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    printf("jmp %c%d",uVar13,(ulong)*(uint *)((long)i + 8));
    break;
  case 0x10:
    pcVar11 = *(char **)((long)i + 0x10);
    pcVar12 = "jmp 0x%p";
    goto LAB_0010ccf4;
  case 0x11:
    uVar14 = *(uint *)((long)i + 8);
    if ((short)uVar14 < 0) {
      if ((uVar14 & 0xffff) != 0xffff) {
        printf("pushinit varidiac, %d nonvar args",(ulong)(-(int)(short)uVar14 - 2));
        return 0x28;
      }
      pcVar11 = "pushinit";
      goto LAB_0010c65e;
    }
    pcVar11 = dill_type_names[uVar10 & 0xf];
    uVar13 = 0x50;
    if (99 < (int)uVar14) {
      iVar4 = dill_type_of(c,uVar14);
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    uVar10 = *(uint *)((long)i + 8);
    pcVar12 = "push%s %c%d";
LAB_0010c887:
    printf(pcVar12,pcVar11,uVar13,(ulong)uVar10);
    break;
  case 0x12:
    if ((ulong)(uVar10 & 0xf) == 8) {
      uVar9 = *(undefined8 *)((long)i + 0x10);
      pcVar12 = "push%si 0x%p";
      pcVar11 = dill_type_names[8];
    }
    else {
      pcVar11 = dill_type_names[uVar10 & 0xf];
      uVar9 = *(undefined8 *)((long)i + 0x10);
      pcVar12 = "push%si 0x%zx";
    }
    goto LAB_0010ce3f;
  case 0x13:
    printf("push%si %g",*(undefined8 *)((long)i + 0x10),dill_type_names[(char)bVar1]);
    break;
  case 0x14:
    uVar13 = (ulong)(uVar10 & 0xf);
    if (uVar13 != 0xb) {
      if ((bVar1 & 0x10) == 0) {
        lVar7 = *(long *)((long)i + 0x20);
        pcVar11 = dill_type_names[uVar13];
        uVar9 = *(undefined8 *)((long)i + 0x10);
        iVar4 = *(int *)((long)i + 8);
        if (lVar7 != 0) {
          uVar13 = 0x50;
          if (99 < iVar4) {
            iVar4 = dill_type_of(c,iVar4);
            uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
          }
          printf("call%s 0x%p<%s>, %c%d",pcVar11,uVar9,lVar7,uVar13,(ulong)*(uint *)((long)i + 8));
          return 0x28;
        }
        uVar13 = 0x50;
        if (99 < iVar4) {
          iVar4 = dill_type_of(c,iVar4);
          uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
        }
        uVar10 = *(uint *)((long)i + 8);
        pcVar12 = "call%s 0x%p, %c%d";
      }
      else {
        pcVar11 = dill_type_names[uVar13];
        uVar9 = *(undefined8 *)((long)i + 0x18);
        uVar13 = 0x50;
        if (99 < *(int *)((long)i + 8)) {
          iVar4 = dill_type_of(c,*(int *)((long)i + 8));
          uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
        }
        uVar10 = *(uint *)((long)i + 8);
        pcVar12 = "call%s R%p, %c%d";
      }
      printf(pcVar12,pcVar11,uVar9,uVar13,(ulong)uVar10);
      return 0x28;
    }
    pcVar11 = dill_type_names[0xb];
    if ((bVar1 & 0x10) == 0) {
      uVar9 = *(undefined8 *)((long)i + 0x10);
      if (*(long *)((long)i + 0x20) != 0) {
        printf("call%s 0x%p<%s>",dill_type_names[0xb],uVar9);
        return 0x28;
      }
      pcVar12 = "call%s 0x%p";
    }
    else {
      uVar9 = *(undefined8 *)((long)i + 0x18);
      pcVar12 = "call%s R%p";
    }
LAB_0010ce3f:
    printf(pcVar12,pcVar11,uVar9);
    break;
  case 0x15:
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    printf("lea %c%d, %c%d, %zx",(ulong)uVar14,(ulong)uVar15,(ulong)uVar10,
           (ulong)*(uint *)((long)i + 0xc),*(undefined8 *)((long)i + 0x10));
    break;
  case 0x16:
    ppcVar6 = compare_op_names;
LAB_0010cbe3:
    pcVar11 = ppcVar6[(char)bVar1];
    uVar10 = 0x50;
    uVar14 = 0x50;
    if (99 < *(int *)((long)i + 8)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 8));
      uVar14 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar15 = *(uint *)((long)i + 8);
    if (99 < *(int *)((long)i + 0xc)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0xc));
      uVar10 = (uint)(iVar4 != 0xc) << 4 | 0x42;
    }
    uVar2 = *(uint *)((long)i + 0xc);
    uVar13 = 0x50;
    if (99 < *(int *)((long)i + 0x10)) {
      iVar4 = dill_type_of(c,*(int *)((long)i + 0x10));
      uVar13 = (ulong)((uint)(iVar4 != 0xc) << 4 | 0x42);
    }
    pcVar12 = "%s%s%s %c%d, %c%d, %c%d";
LAB_0010cc8e:
    printf(pcVar12 + 4,pcVar11,(ulong)uVar14,(ulong)uVar15,(ulong)uVar10,(ulong)uVar2,uVar13);
    break;
  case 0x17:
    pdVar3 = c->p;
    printf("L%d:",(ulong)*(uint *)((long)i + 8));
    ppcVar6 = (pdVar3->branch_table).label_name;
    lVar7 = (long)*(int *)((long)i + 8);
LAB_0010cce0:
    pcVar11 = ppcVar6[lVar7];
    if (pcVar11 != (char *)0x0) {
      pcVar12 = "<%s>";
LAB_0010ccf4:
      printf(pcVar12,pcVar11);
    }
    break;
  case 0x18:
    pcVar11 = "nop";
LAB_0010c65e:
    printf(pcVar11);
  }
  return 0x28;
}

Assistant:

extern int
virtual_print_insn(dill_stream c, void* info_ptr, void* i)
{
    virtual_insn* insn = (virtual_insn*)i;
    int insn_code = insn->insn_code;
    switch (insn->class_code) {
    case iclass_arith3:
        printf("%s %c%d, %c%d, %c%d", arith3_name[insn_code],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    case iclass_arith3i:
        printf("%si %c%d, %c%d, %zu", arith3_name[insn_code],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    case iclass_arith2:
        printf("%s %c%d, %c%d", arith2_name[insn_code],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    case iclass_convert: {
        int from_index = (insn->insn_code >> 4) & 0xf;
        int to_index = insn->insn_code & 0xf;
        printf("cv%s2%s %c%d, %c%d", dill_type_names[from_index],
               dill_type_names[to_index], OPND(insn->opnds.a2.dest),
               OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_loadstore: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%s %c%d, %c%d, %c%d", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_loadstorei: {
        int typ = insn->insn_code & 0xf;
        int store = (insn->insn_code & 0x10) == 0x10;
        int bswap = (insn->insn_code & 0x20) == 0x20;
        printf("%s%s%si %c%d, %c%d, %zu", bswap ? "bs" : "",
               store == 0 ? "ld" : "st", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), OPND(insn->opnds.a3i.src),
               insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_lea: {
        printf("lea %c%d, %c%d, %zx", OPND(insn->opnds.a3i.dest),
               OPND(insn->opnds.a3i.src), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_set: {
        int typ = insn->insn_code & 0xf;
        printf("set%s %c%d, %zx", dill_type_names[typ],
               OPND(insn->opnds.a3i.dest), insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_setf: {
        int typ = insn->insn_code & 0xf;
        union {
            double imm;
            int imm_i[2];
        } u;
        u.imm = insn->opnds.sf.imm;
        printf("set%s %c%d, %g 0x(%x)0x(%x)", dill_type_names[typ],
               OPND(insn->opnds.sf.dest), insn->opnds.sf.imm, u.imm_i[0],
               u.imm_i[1]);
        break;
    }
    case iclass_mov: {
        int typ = insn->insn_code & 0xf;
        printf("mov%s %c%d, %c%d", dill_type_names[typ],
               OPND(insn->opnds.a2.dest), OPND(insn->opnds.a2.src));
        break;
    }
    case iclass_reti: {
        int typ = insn->insn_code & 0xf;
        printf("ret%si %zu", dill_type_names[typ], insn->opnds.a3i.u.imm);
        break;
    }
    case iclass_ret: {
        int typ = insn->insn_code & 0xf;
        printf("ret%s %c%d", dill_type_names[typ], OPND(insn->opnds.a1.src));
        break;
    }
    case iclass_branch: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%s %c%d, %c%d, L%d", branch_op_names[br_op],
               OPND(insn->opnds.br.src1), OPND(insn->opnds.br.src2),
               insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_compare: {
        int c_op = insn->insn_code;
        printf("%s %c%d, %c%d, %c%d", compare_op_names[c_op],
               OPND(insn->opnds.a3.dest), OPND(insn->opnds.a3.src1),
               OPND(insn->opnds.a3.src2));
        break;
    }
    case iclass_branchi: {
        int br_op = insn->insn_code;
        struct branch_table* t = &c->p->branch_table;
        printf("b%si %c%d, %p, L%d", branch_op_names[br_op],
               OPND(insn->opnds.bri.src), (void*)insn->opnds.bri.imm_l,
               insn->opnds.bri.label);
        if (t->label_name[insn->opnds.bri.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.bri.label]);
        }
        break;
    }
    case iclass_jump_to_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("br L%d", insn->opnds.br.label);
        if (t->label_name[insn->opnds.br.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.br.label]);
        }
        break;
    }
    case iclass_mark_label: {
        struct branch_table* t = &c->p->branch_table;
        printf("L%d:", insn->opnds.label.label);
        if (t->label_name[insn->opnds.label.label] != NULL) {
            printf("<%s>", t->label_name[insn->opnds.label.label]);
        }
        break;
    }
    case iclass_jump_to_reg: {
        printf("jmp %c%d", OPND(insn->opnds.br.src1));
        break;
    }
    case iclass_jump_to_imm: {
        printf("jmp 0x%p", insn->opnds.bri.imm_a);
        break;
    }
    case iclass_special: {
        switch (insn->opnds.spec.type) {
        case DILL_NOP:
            printf("special NOP");
            break;
        case DILL_SEGMENTED_FOLLOWS:
            printf("special SEGMENTED %s",
                   prefix_names[insn->opnds.spec.param]);
            break;
        }
        break;
    }
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        int reg = insn->insn_code & 0x10;
        if (typ != DILL_V) {
            if (reg != 0) {
                printf("call%s R%p, %c%d", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l,
                       OPND(insn->opnds.calli.src));
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name,
                           OPND(insn->opnds.calli.src));
                } else {
                    printf("call%s 0x%p, %c%d", dill_type_names[typ],
                           insn->opnds.calli.imm_a,
                           OPND(insn->opnds.calli.src));
                }
            }
        } else {
            if (reg != 0) {
                printf("call%s R%p", dill_type_names[typ],
                       (void*)insn->opnds.calli.imm_l);
            } else {
                const char* call_name = insn->opnds.calli.xfer_name;
                if (call_name) {
                    printf("call%s 0x%p<%s>", dill_type_names[typ],
                           insn->opnds.calli.imm_a, call_name);
                } else {
                    printf("call%s 0x%p", dill_type_names[typ],
                           insn->opnds.calli.imm_a);
                }
            }
        }
        break;
    }
    case iclass_push: {
        int typ = insn->insn_code & 0xf;
        if ((short)insn->opnds.a1.src < 0) {
            if ((short)insn->opnds.a1.src == -1) {
                printf("pushinit");
            } else {
                int non_var_arg = -((short)insn->opnds.a1.src) - 2;
                printf("pushinit varidiac, %d nonvar args", non_var_arg);
            }
        } else {
            printf("push%s %c%d", dill_type_names[typ],
                   OPND(insn->opnds.a1.src));
        }
        break;
    }
    case iclass_pushi: {
        int typ = insn->insn_code & 0xf;
        if (typ == DILL_P) {
            printf("push%si 0x%p", dill_type_names[typ],
                   insn->opnds.a3i.u.imm_a);
        } else {
            printf("push%si 0x%zx", dill_type_names[typ],
                   insn->opnds.a3i.u.imm);
        }
        break;
    }
    case iclass_pushf: {
        int typ = insn->insn_code;
        printf("push%si %g", dill_type_names[typ], insn->opnds.sf.imm);
        break;
    }
    case iclass_nop:
        printf("nop");
    }
    return sizeof(*insn);
}